

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

int uv_tty_init(uv_loop_t *loop,uv_tty_t *tty,int fd,int readable)

{
  int in_ECX;
  uint in_EDX;
  uv_loop_t *in_RSI;
  
  uv__stream_init(in_RSI,(uv_stream_t *)CONCAT44(in_EDX,in_ECX),UV_UNKNOWN_HANDLE);
  if (in_ECX == 0) {
    uv__stream_open((uv_stream_t *)((ulong)in_EDX << 0x20),0,0x11c205);
    in_RSI->stop_flag = in_RSI->stop_flag | 0x80;
  }
  else {
    uv__nonblock((int)in_RSI,in_EDX);
    uv__stream_open((uv_stream_t *)CONCAT44(in_EDX,in_ECX),0,0x11c1f0);
  }
  *(undefined4 *)((long)&in_RSI->closing_handles + 4) = 0;
  return 0;
}

Assistant:

int uv_tty_init(uv_loop_t* loop, uv_tty_t* tty, int fd, int readable) {
  uv__stream_init(loop, (uv_stream_t*)tty, UV_TTY);

#if defined(__APPLE__)
  {
    int err = uv__stream_try_select((uv_stream_t*) tty, &fd);
    if (err)
      return err;
  }
#endif /* defined(__APPLE__) */

  if (readable) {
    uv__nonblock(fd, 1);
    uv__stream_open((uv_stream_t*)tty, fd, UV_STREAM_READABLE);
  } else {
    /* Note: writable tty we set to blocking mode. */
    uv__stream_open((uv_stream_t*)tty, fd, UV_STREAM_WRITABLE);
    tty->flags |= UV_STREAM_BLOCKING;
  }

  tty->mode = 0;
  return 0;
}